

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc stbi__get_marker(stbi__jpeg *j)

{
  stbi__context *psVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi_uc *psVar5;
  
  sVar3 = j->marker;
  if (sVar3 != 0xff) {
    j->marker = 0xff;
    return sVar3;
  }
  psVar1 = j->s;
  psVar5 = psVar1->img_buffer;
  if (psVar1->img_buffer_end <= psVar5) {
    if (psVar1->read_from_callbacks == 0) {
      return 0xff;
    }
    psVar5 = psVar1->buffer_start;
    iVar4 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar5,psVar1->buflen);
    if (iVar4 == 0) {
      psVar1->read_from_callbacks = 0;
      psVar1->img_buffer = psVar5;
      psVar1->img_buffer_end = psVar1->buffer_start + 1;
      psVar1->buffer_start[0] = '\0';
    }
    else {
      psVar1->img_buffer = psVar5;
      psVar1->img_buffer_end = psVar5 + iVar4;
    }
    psVar5 = psVar1->img_buffer;
  }
  psVar1->img_buffer = psVar5 + 1;
  sVar3 = 0xff;
  sVar2 = *psVar5;
  do {
    while( true ) {
      if (sVar2 != 0xff) {
        return sVar3;
      }
      psVar1 = j->s;
      psVar5 = psVar1->img_buffer;
      if (psVar1->img_buffer_end <= psVar5) break;
LAB_0016e1f9:
      psVar1->img_buffer = psVar5 + 1;
      sVar3 = *psVar5;
      sVar2 = sVar3;
    }
    if (psVar1->read_from_callbacks != 0) {
      psVar5 = psVar1->buffer_start;
      iVar4 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar5,psVar1->buflen);
      if (iVar4 == 0) {
        psVar1->read_from_callbacks = 0;
        psVar1->img_buffer = psVar5;
        psVar1->img_buffer_end = psVar1->buffer_start + 1;
        psVar1->buffer_start[0] = '\0';
      }
      else {
        psVar1->img_buffer = psVar5;
        psVar1->img_buffer_end = psVar5 + iVar4;
      }
      psVar5 = psVar1->img_buffer;
      goto LAB_0016e1f9;
    }
    sVar3 = '\0';
    sVar2 = sVar3;
  } while( true );
}

Assistant:

static stbi_uc stbi__get_marker(stbi__jpeg *j)
{
   stbi_uc x;
   if (j->marker != STBI__MARKER_none) { x = j->marker; j->marker = STBI__MARKER_none; return x; }
   x = stbi__get8(j->s);
   if (x != 0xff) return STBI__MARKER_none;
   while (x == 0xff)
      x = stbi__get8(j->s); // consume repeated 0xff fill bytes
   return x;
}